

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void art_iterator_insert(art_iterator_t *iterator,art_key_chunk_t *key,art_val_t val)

{
  art_insert(iterator->art,key,val);
  iterator->depth = '\0';
  iterator->frame = '\0';
  art_node_iterator_lower_bound(iterator->art->root,iterator,key);
  return;
}

Assistant:

void art_iterator_insert(art_iterator_t *iterator, const art_key_chunk_t *key,
                         art_val_t val) {
    // TODO: This can likely be faster.
    art_insert(iterator->art, key, val);
    assert(iterator->art->root != CROARING_ART_NULL_REF);
    iterator->frame = 0;
    iterator->depth = 0;
    art_node_iterator_lower_bound(iterator->art->root, iterator, key);
}